

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cpp
# Opt level: O2

bool __thiscall spvtools::opt::Function::HasEarlyReturn(Function *this)

{
  pointer puVar1;
  bool bVar2;
  PostDominatorAnalysis *this_00;
  unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_> *block;
  pointer puVar3;
  Function *local_30;
  
  this_00 = IRContext::GetPostDominatorAnalysis
                      (*(IRContext **)
                        (*(long *)((long)(((this->blocks_).
                                           super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                                         super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                                         ._M_t + 8) + 0x20),this);
  puVar1 = (this->blocks_).
           super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar3 = (this->blocks_).
                super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar3 != puVar1; puVar3 = puVar3 + 1) {
    BasicBlock::tail((BasicBlock *)&stack0xffffffffffffffd0);
    bVar2 = spvOpcodeIsReturn(*(Op *)&(local_30->debug_insts_in_header_).
                                      super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
                                      super_IntrusiveNodeBase<spvtools::opt::Instruction>.
                                      _vptr_IntrusiveNodeBase);
    if (bVar2) {
      bVar2 = DominatorAnalysisBase::Dominates
                        (&this_00->super_DominatorAnalysisBase,
                         (puVar3->_M_t).
                         super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                         .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl,
                         (BasicBlock *)
                         (((this->blocks_).
                           super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                         super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                         ._M_t);
      if (!bVar2) break;
    }
  }
  return puVar3 != puVar1;
}

Assistant:

bool Function::HasEarlyReturn() const {
  auto post_dominator_analysis =
      blocks_.front()->GetLabel()->context()->GetPostDominatorAnalysis(this);
  for (auto& block : blocks_) {
    if (spvOpcodeIsReturn(block->tail()->opcode()) &&
        !post_dominator_analysis->Dominates(block.get(), entry().get())) {
      return true;
    }
  }
  return false;
}